

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::CumulativeReporterBase::assertionEnded
          (CumulativeReporterBase *this,AssertionStats *assertionStats)

{
  bool bVar1;
  reference this_00;
  SectionNode *pSVar2;
  SectionNode *sectionNode;
  AssertionStats *assertionStats_local;
  CumulativeReporterBase *this_local;
  
  bVar1 = std::
          vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
          ::empty(&this->m_sectionStack);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_sectionStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/sutbult[P]redux-cpp/tests/catch.hpp"
                  ,0x220f,
                  "virtual bool Catch::CumulativeReporterBase::assertionEnded(const AssertionStats &)"
                 );
  }
  this_00 = std::
            vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
            ::back(&this->m_sectionStack);
  pSVar2 = Ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(this_00);
  std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::push_back
            (&pSVar2->assertions,assertionStats);
  return true;
}

Assistant:

virtual bool assertionEnded( AssertionStats const& assertionStats ) CATCH_OVERRIDE {
            assert( !m_sectionStack.empty() );
            SectionNode& sectionNode = *m_sectionStack.back();
            sectionNode.assertions.push_back( assertionStats );
            return true;
        }